

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active.cc
# Opt level: O1

base_learner * active_setup(options_i *options,vw *all)

{
  _func_int **pp_Var1;
  vw *all_00;
  int iVar2;
  active *paVar3;
  option_group_definition *poVar4;
  typed_option<float> *ptVar5;
  base_learner *l;
  single_learner *base;
  learner<active,_example> *plVar6;
  vw_exception *this;
  bool active_option;
  bool simulation;
  size_type __dnew_2;
  option_group_definition new_options;
  size_type __dnew;
  size_type __dnew_1;
  stringstream __msg;
  bool local_62a;
  bool local_629;
  active *local_628;
  vw *local_620;
  long local_618;
  _func_int ***local_610;
  _func_int **local_608;
  _func_int **local_600 [2];
  _func_int ***local_5f0;
  _func_int **local_5e8;
  _func_int **local_5e0 [2];
  string local_5d0;
  option_group_definition local_5b0;
  long *local_578;
  long local_570;
  long local_568 [2];
  string local_558;
  string local_538;
  undefined7 *local_518;
  undefined8 local_510;
  undefined7 local_508;
  undefined1 uStack_501;
  undefined7 uStack_500;
  undefined1 local_4f9;
  string local_4f8;
  undefined1 local_4d8 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_450;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_440;
  typed_option<float> local_438;
  undefined1 local_398 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_380;
  string local_368 [64];
  bool local_328;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_310;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_300;
  typed_option<float> local_210;
  typed_option<bool> local_170;
  typed_option<bool> local_d0;
  
  paVar3 = calloc_or_throw<active>(1);
  *(undefined8 *)paVar3 = 0;
  paVar3->all = (vw *)0x0;
  local_62a = false;
  local_629 = false;
  uStack_500 = 0x676e696e726165;
  local_508 = 0x20657669746341;
  uStack_501 = 0x4c;
  local_510 = 0xf;
  local_4f9 = 0;
  local_5b0.m_name._M_dataplus._M_p = (pointer)&local_5b0.m_name.field_2;
  local_628 = paVar3;
  local_518 = &local_508;
  std::__cxx11::string::_M_construct<char*>((string *)&local_5b0,&local_508);
  local_5b0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5b0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5b0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_518 != &local_508) {
    operator_delete(local_518);
  }
  local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
  local_5d0.field_2._M_allocated_capacity._0_4_ = 0x69746361;
  local_5d0.field_2._M_allocated_capacity._4_2_ = 0x6576;
  local_5d0._M_string_length = 6;
  local_5d0.field_2._M_local_buf[6] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_398,&local_5d0,&local_62a);
  local_328 = true;
  local_5f0 = local_5e0;
  local_4d8._0_8_ = (_func_int **)0x16;
  local_5f0 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_5f0,(ulong)local_4d8);
  local_5e0[0] = (_func_int **)local_4d8._0_8_;
  *local_5f0 = (_func_int **)0x6120656c62616e65;
  local_5f0[1] = (_func_int **)0x656c206576697463;
  builtin_strncpy((char *)((long)local_5f0 + 0xe),"learning",8);
  local_5e8 = (_func_int **)local_4d8._0_8_;
  *(char *)((long)local_5f0 + local_4d8._0_8_) = '\0';
  std::__cxx11::string::_M_assign(local_368);
  VW::config::typed_option<bool>::typed_option(&local_d0,(typed_option<bool> *)local_398);
  local_620 = all;
  poVar4 = VW::config::option_group_definition::add<bool>(&local_5b0,&local_d0);
  local_538.field_2._M_allocated_capacity = 0x6974616c756d6973;
  local_538.field_2._8_2_ = 0x6e6f;
  local_538._M_string_length = 10;
  local_538.field_2._M_local_buf[10] = '\0';
  local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_4d8,&local_538,&local_629);
  local_610 = local_600;
  local_438.super_base_option._vptr_base_option = (_func_int **)0x1f;
  local_610 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_610,(ulong)&local_438);
  local_600[0] = local_438.super_base_option._vptr_base_option;
  builtin_strncpy((char *)((long)local_610 + 0xf)," simulat",8);
  builtin_strncpy((char *)((long)local_610 + 0x17),"ion mode",8);
  *local_610 = (_func_int **)0x6c20657669746361;
  local_610[1] = (_func_int **)0x20676e696e726165;
  local_608 = local_438.super_base_option._vptr_base_option;
  *(char *)((long)local_610 + (long)local_438.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_4d8 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_170,(typed_option<bool> *)local_4d8);
  poVar4 = VW::config::option_group_definition::add<bool>(poVar4,&local_170);
  local_558.field_2._M_allocated_capacity = 0x656e776f6c6c656d;
  local_558.field_2._8_2_ = 0x7373;
  local_558._M_string_length = 10;
  local_558.field_2._M_local_buf[10] = '\0';
  local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
  VW::config::typed_option<float>::typed_option(&local_438,&local_558,&paVar3->active_c0);
  ptVar5 = VW::config::typed_option<float>::default_value(&local_438,8.0);
  local_618 = 0x33;
  local_578 = local_568;
  local_578 = (long *)std::__cxx11::string::_M_create((ulong *)&local_578,(ulong)&local_618);
  local_568[0] = local_618;
  local_578[4] = 0x305f632072657465;
  local_578[5] = 0x6c7561666544202e;
  local_578[2] = 0x656e776f6c6c656d;
  local_578[3] = 0x6d61726170207373;
  *local_578 = 0x6c20657669746361;
  local_578[1] = 0x20676e696e726165;
  builtin_strncpy((char *)((long)local_578 + 0x2f),"lt 8",4);
  local_570 = local_618;
  *(char *)((long)local_578 + local_618) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar5->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_210,ptVar5);
  VW::config::option_group_definition::add<float>(poVar4,&local_210);
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cffa0;
  if (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if (local_578 != local_568) {
    operator_delete(local_578);
  }
  local_438.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cffa0;
  if (local_438.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_438.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_438.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_438.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_438.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_558._M_dataplus._M_p != &local_558.field_2) {
    operator_delete(local_558._M_dataplus._M_p);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cffd8;
  if (local_170.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_610 != local_600) {
    operator_delete(local_610);
  }
  local_4d8._0_8_ = &PTR__typed_option_002cffd8;
  if (local_440._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_440._M_pi);
  }
  if (local_450._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_450._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_4d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538._M_dataplus._M_p != &local_538.field_2) {
    operator_delete(local_538._M_dataplus._M_p);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cffd8;
  if (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_5f0 != local_5e0) {
    operator_delete(local_5f0);
  }
  local_398._0_8_ = &PTR__typed_option_002cffd8;
  if (local_300._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_300._M_pi);
  }
  paVar3 = local_628;
  if (local_310._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_310._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_398);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
    operator_delete(local_5d0._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_5b0);
  all_00 = local_620;
  if (local_62a == false) {
    plVar6 = (learner<active,_example> *)0x0;
  }
  else {
    paVar3->all = local_620;
    pp_Var1 = (_func_int **)(local_398 + 0x10);
    local_398._16_4_ = 0x61646c;
    local_398._8_8_ = (pointer)0x3;
    local_398._0_8_ = pp_Var1;
    iVar2 = (*options->_vptr_options_i[1])(options,local_398);
    if ((_func_int **)local_398._0_8_ != pp_Var1) {
      operator_delete((void *)local_398._0_8_);
    }
    if ((char)iVar2 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)local_398);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_398 + 0x10),"error: you can\'t combine lda and active learning",
                 0x30);
      this = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/active.cc"
                 ,0xa0,&local_4f8);
      __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    l = setup_base(options,all_00);
    base = LEARNER::as_singleline<char,char>(l);
    local_398._16_8_ = 0x6974616c756d6973;
    local_380._M_allocated_capacity._0_2_ = 0x6e6f;
    local_398._8_8_ = (pointer)0xa;
    local_380._M_local_buf[2] = '\0';
    local_398._0_8_ = pp_Var1;
    iVar2 = (*options->_vptr_options_i[1])(options);
    if ((_func_int **)local_398._0_8_ != pp_Var1) {
      operator_delete((void *)local_398._0_8_);
    }
    if ((char)iVar2 == '\0') {
      all_00->active = true;
      plVar6 = LEARNER::learner<active,example>::init_learner<LEARNER::learner<char,example>>
                         (local_628,base,predict_or_learn_active<true>,
                          predict_or_learn_active<false>,1,*(prediction_type_t *)(base + 0xd0));
      *(undefined8 *)(plVar6 + 0x58) = *(undefined8 *)(plVar6 + 0x18);
      *(code **)(plVar6 + 0x68) = return_active_example;
    }
    else {
      plVar6 = LEARNER::learner<active,example>::init_learner<LEARNER::learner<char,example>>
                         (local_628,base,predict_or_learn_simulation<true>,
                          predict_or_learn_simulation<false>,1,*(prediction_type_t *)(base + 0xd0));
    }
    paVar3 = (active *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_5b0.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0.m_name._M_dataplus._M_p != &local_5b0.m_name.field_2) {
    operator_delete(local_5b0.m_name._M_dataplus._M_p);
  }
  if (paVar3 != (active *)0x0) {
    free(paVar3);
  }
  return (base_learner *)plVar6;
}

Assistant:

base_learner* active_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<active>();

  bool active_option = false;
  bool simulation = false;
  option_group_definition new_options("Active Learning");
  new_options.add(make_option("active", active_option).keep().help("enable active learning"))
      .add(make_option("simulation", simulation).help("active learning simulation mode"))
      .add(make_option("mellowness", data->active_c0)
               .default_value(8.f)
               .help("active learning mellowness parameter c_0. Default 8"));
  options.add_and_parse(new_options);

  if (!active_option)
    return nullptr;

  data->all = &all;

  if (options.was_supplied("lda"))
    THROW("error: you can't combine lda and active learning");

  auto base = as_singleline(setup_base(options, all));

  // Create new learner
  learner<active, example>* l;
  if (options.was_supplied("simulation"))
    l = &init_learner(data, base, predict_or_learn_simulation<true>, predict_or_learn_simulation<false>);
  else
  {
    all.active = true;
    l = &init_learner(data, base, predict_or_learn_active<true>, predict_or_learn_active<false>);
    l->set_finish_example(return_active_example);
  }

  return make_base(*l);
}